

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::PropagateAbsStats(duckdb *this,ClientContext *context,FunctionStatisticsInput *input)

{
  LogicalType *type;
  long lVar1;
  vector<duckdb::BaseStatistics,_true> *this_00;
  long *plVar2;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var3;
  long *plVar4;
  char cVar5;
  reference pvVar6;
  ulong uVar7;
  ulong uVar8;
  reference pvVar9;
  BaseStatistics stats;
  Value new_max;
  Value new_min;
  _Any_data local_180;
  code *local_170;
  LogicalType local_128 [24];
  LogicalType local_110 [24];
  LogicalType local_f8 [24];
  LogicalType local_e0 [24];
  LogicalType local_c8 [24];
  Value local_b0 [64];
  Value local_70 [64];
  
  lVar1 = *(long *)input;
  this_00 = *(vector<duckdb::BaseStatistics,_true> **)(input + 0x10);
  pvVar6 = vector<duckdb::BaseStatistics,_true>::operator[](this_00,0);
  duckdb::LogicalType::LogicalType(local_c8,SQLNULL);
  duckdb::Value::Value(local_70,local_c8);
  duckdb::LogicalType::~LogicalType(local_c8);
  duckdb::LogicalType::LogicalType(local_e0,SQLNULL);
  duckdb::Value::Value(local_b0,local_e0);
  duckdb::LogicalType::~LogicalType(local_e0);
  cVar5 = duckdb::NumericStats::HasMinMax(pvVar6);
  if (cVar5 == '\0') {
    duckdb::LogicalType::LogicalType(local_f8,(LogicalType *)(lVar1 + 0x38));
    duckdb::Value::Value((Value *)&local_180,local_f8);
    duckdb::Value::operator=(local_70,(Value *)local_180._M_pod_data);
    duckdb::Value::~Value((Value *)local_180._M_pod_data);
    duckdb::LogicalType::~LogicalType(local_f8);
    duckdb::LogicalType::LogicalType(local_110,(LogicalType *)(lVar1 + 0x38));
    duckdb::Value::Value((Value *)&local_180,local_110);
    duckdb::Value::operator=(local_b0,(Value *)local_180._M_pod_data);
    duckdb::Value::~Value((Value *)local_180._M_pod_data);
    duckdb::LogicalType::~LogicalType(local_110);
  }
  else {
    switch(*(undefined1 *)(lVar1 + 0x39)) {
    case 3:
      duckdb::NumericStats::Min((BaseStatistics *)local_180._M_pod_data);
      duckdb::Value::GetValue<signed_char>();
      duckdb::Value::~Value((Value *)local_180._M_pod_data);
      break;
    default:
      *(undefined8 *)this = 0;
      goto LAB_006b924f;
    case 5:
      duckdb::NumericStats::Min((BaseStatistics *)local_180._M_pod_data);
      duckdb::Value::GetValue<short>();
      duckdb::Value::~Value((Value *)local_180._M_pod_data);
      break;
    case 7:
      duckdb::NumericStats::Min((BaseStatistics *)local_180._M_pod_data);
      duckdb::Value::GetValue<int>();
      duckdb::Value::~Value((Value *)local_180._M_pod_data);
      break;
    case 9:
      duckdb::NumericStats::Min((BaseStatistics *)local_180._M_pod_data);
      duckdb::Value::GetValue<long>();
      duckdb::Value::~Value((Value *)local_180._M_pod_data);
    }
    duckdb::NumericStats::Min((BaseStatistics *)local_180._M_pod_data);
    uVar7 = duckdb::Value::GetValue<long>();
    duckdb::Value::~Value((Value *)local_180._M_pod_data);
    duckdb::NumericStats::Max((BaseStatistics *)local_180._M_pod_data);
    uVar8 = duckdb::Value::GetValue<long>();
    duckdb::Value::~Value((Value *)local_180._M_pod_data);
    if ((-1 < (long)(uVar8 & uVar7)) && (-1 < (long)uVar7)) {
      pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                             *)(*(long *)input + 0x180),0);
      plVar2 = *(long **)(input + 0x18);
      _Var3._M_head_impl =
           (pvVar9->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
           _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (pvVar9->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      plVar4 = (long *)*plVar2;
      *plVar2 = (long)_Var3._M_head_impl;
      if (plVar4 != (long *)0x0) {
        (**(code **)(*plVar4 + 8))();
      }
      vector<duckdb::BaseStatistics,_true>::operator[](this_00,0);
      duckdb::BaseStatistics::ToUnique();
      goto LAB_006b924f;
    }
    type = (LogicalType *)(lVar1 + 0x38);
    duckdb::Value::Numeric((LogicalType *)local_180._M_pod_data,(long)type);
    duckdb::Value::operator=(local_70,(Value *)local_180._M_pod_data);
    duckdb::Value::~Value((Value *)local_180._M_pod_data);
    duckdb::Value::Numeric((LogicalType *)local_180._M_pod_data,(long)type);
    duckdb::Value::operator=(local_b0,(Value *)local_180._M_pod_data);
    duckdb::Value::~Value((Value *)local_180._M_pod_data);
    ScalarFunction::GetScalarUnaryFunction<duckdb::AbsOperator>
              ((scalar_function_t *)&local_180,type);
    std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    operator=((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              (lVar1 + 0x108),
              (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              &local_180);
    if (local_170 != (code *)0x0) {
      (*local_170)(&local_180,&local_180,__destroy_functor);
    }
  }
  duckdb::LogicalType::LogicalType(local_128,(LogicalType *)(lVar1 + 0x38));
  duckdb::NumericStats::CreateEmpty(&local_180,local_128);
  duckdb::LogicalType::~LogicalType(local_128);
  duckdb::NumericStats::SetMin((BaseStatistics *)local_180._M_pod_data,local_70);
  duckdb::NumericStats::SetMax((BaseStatistics *)local_180._M_pod_data,local_b0);
  duckdb::BaseStatistics::CopyValidity((BaseStatistics *)local_180._M_pod_data);
  duckdb::BaseStatistics::ToUnique();
  duckdb::BaseStatistics::~BaseStatistics((BaseStatistics *)local_180._M_pod_data);
LAB_006b924f:
  duckdb::Value::~Value(local_b0);
  duckdb::Value::~Value(local_70);
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

static unique_ptr<BaseStatistics> PropagateAbsStats(ClientContext &context, FunctionStatisticsInput &input) {
	auto &child_stats = input.child_stats;
	auto &expr = input.expr;
	D_ASSERT(child_stats.size() == 1);
	// can only propagate stats if the children have stats
	auto &lstats = child_stats[0];
	Value new_min, new_max;
	bool potential_overflow = true;
	if (NumericStats::HasMinMax(lstats)) {
		switch (expr.return_type.InternalType()) {
		case PhysicalType::INT8:
			potential_overflow = NumericStats::Min(lstats).GetValue<int8_t>() == NumericLimits<int8_t>::Minimum();
			break;
		case PhysicalType::INT16:
			potential_overflow = NumericStats::Min(lstats).GetValue<int16_t>() == NumericLimits<int16_t>::Minimum();
			break;
		case PhysicalType::INT32:
			potential_overflow = NumericStats::Min(lstats).GetValue<int32_t>() == NumericLimits<int32_t>::Minimum();
			break;
		case PhysicalType::INT64:
			potential_overflow = NumericStats::Min(lstats).GetValue<int64_t>() == NumericLimits<int64_t>::Minimum();
			break;
		default:
			return nullptr;
		}
	}
	if (potential_overflow) {
		new_min = Value(expr.return_type);
		new_max = Value(expr.return_type);
	} else {
		// no potential overflow

		// compute stats
		auto current_min = NumericStats::Min(lstats).GetValue<int64_t>();
		auto current_max = NumericStats::Max(lstats).GetValue<int64_t>();

		int64_t min_val, max_val;

		if (current_min < 0 && current_max < 0) {
			// if both min and max are below zero, then min=abs(cur_max) and max=abs(cur_min)
			min_val = AbsValue(current_max);
			max_val = AbsValue(current_min);
		} else if (current_min < 0) {
			D_ASSERT(current_max >= 0);
			// if min is below zero and max is above 0, then min=0 and max=max(cur_max, abs(cur_min))
			min_val = 0;
			max_val = MaxValue(AbsValue(current_min), current_max);
		} else {
			// if both current_min and current_max are > 0, then the abs is a no-op and can be removed entirely
			*input.expr_ptr = std::move(input.expr.children[0]);
			return child_stats[0].ToUnique();
		}
		new_min = Value::Numeric(expr.return_type, min_val);
		new_max = Value::Numeric(expr.return_type, max_val);
		expr.function.function = ScalarFunction::GetScalarUnaryFunction<AbsOperator>(expr.return_type);
	}
	auto stats = NumericStats::CreateEmpty(expr.return_type);
	NumericStats::SetMin(stats, new_min);
	NumericStats::SetMax(stats, new_max);
	stats.CopyValidity(lstats);
	return stats.ToUnique();
}